

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_rc_Buf.h
# Opt level: O0

void __thiscall
axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::attachBufHdr
          (BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *this,BufHdr *hdr)

{
  RefCount *in_RSI;
  long in_RDI;
  
  if (in_RSI != *(RefCount **)(in_RDI + 8)) {
    if (in_RSI != (RefCount *)0x0) {
      RefCount::addRef((RefCount *)0x132ae6);
    }
    if (*(long *)(in_RDI + 8) != 0) {
      RefCount::release(in_RSI);
    }
    *(RefCount **)(in_RDI + 8) = in_RSI;
  }
  return;
}

Assistant:

void
	attachBufHdr(BufHdr* hdr) {
		if (hdr == m_hdr)
			return; // try to avoid unnecessary interlocked ops

		if (hdr)
			hdr->addRef();

		if (m_hdr)
			m_hdr->release();

		m_hdr = hdr;
	}